

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this,BayesianGameCollaborativeGraphical *o)

{
  undefined8 uVar1;
  BayesianGameIdenticalPayoff *this_00;
  BayesianGameIdenticalPayoff *pBVar2;
  long in_RSI;
  undefined8 *in_RDI;
  vector<Scope,_std::allocator<Scope>_> *in_stack_00000038;
  vector<Scope,_std::allocator<Scope>_> *in_stack_00000040;
  Index i;
  BayesianGameIdenticalPayoffInterface *in_stack_ffffffffffffff98;
  BayesianGameIdenticalPayoffInterface *in_stack_ffffffffffffffa0;
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *this_01;
  uint local_20;
  
  BayesianGameIdenticalPayoffInterface::BayesianGameIdenticalPayoffInterface
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR__BayesianGameCollaborativeGraphical_00d067e8;
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::vector
            ((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              *)0x8b00d6);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0x8b00ec);
  in_RDI[0x1b] = *(undefined8 *)(in_RSI + 0xd8);
  if (*(long *)(in_RSI + 0x110) != 0) {
    uVar1 = (**(code **)(**(long **)(in_RSI + 0x110) + 0x40))();
    in_RDI[0x22] = uVar1;
  }
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::clear
            ((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              *)0x8b0166);
  local_20 = 0;
  while( true ) {
    this_00 = (BayesianGameIdenticalPayoff *)(ulong)local_20;
    pBVar2 = (BayesianGameIdenticalPayoff *)
             std::
             vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
             size((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                   *)(in_RSI + 0xe0));
    if (this_00 == pBVar2) break;
    this_01 = (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
               *)(in_RDI + 0x1c);
    pBVar2 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
    in_stack_ffffffffffffff98 =
         (BayesianGameIdenticalPayoffInterface *)
         std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
         ::at(this_01,(size_type)in_stack_ffffffffffffff98);
    BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(this_00,pBVar2);
    std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
    push_back(this_01,(value_type *)in_stack_ffffffffffffff98);
    local_20 = local_20 + 1;
  }
  std::vector<Scope,_std::allocator<Scope>_>::operator=(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical(
    const BayesianGameCollaborativeGraphical& o) :
        BayesianGameIdenticalPayoffInterface(o)
{
    _m_nrLRFs = o._m_nrLRFs;
    if( o._m_jt_pd )
        _m_jt_pd = o._m_jt_pd->Clone();
    _m_LRFs.clear();
    for(Index i=0;i!=o._m_LRFs.size();++i)
        _m_LRFs.push_back(new BayesianGameIdenticalPayoff(*o._m_LRFs.at(i)));
    _m_agentScopes=o._m_agentScopes;
}